

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdKelvinTlMode::emulate_mthd(MthdKelvinTlMode *this)

{
  pgraph_state *state;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_kelvin_check_err19(state);
  pgraph_kelvin_check_err18(state);
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource != 0) {
    return;
  }
  iVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
          chipset.card_type;
  if (iVar1 < 0x40) {
    uVar4 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xf_mode_b;
    uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
    uVar5 = (uVar2 & 4) << 0x10;
    uVar3 = uVar2 << 0x1e | uVar5 | uVar4 & 0x3ffbffff;
    if (iVar1 == 0x30) {
      uVar3 = uVar2 << 0x1e | uVar5 | uVar4 & 0x3ff8ffff |
              (uVar2 & 0x10) << 0xd | (uVar2 & 0x100) << 8;
    }
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xf_mode_b = uVar3;
    pgraph_flush_xf_mode(state);
    return;
  }
  iVar1 = pgraph_3d_class(state);
  uVar4 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_xf_a;
  if (iVar1 < 6) {
    uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
    uVar4 = uVar4 & 0xfffffffb | uVar2 & 4;
  }
  else {
    uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
  }
  uVar4 = (uVar2 & 0x100) << 0x14 | uVar4 & 0xefffffff;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_xf_a = uVar4;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_xf_c =
       (uVar2 & 0x10) << 0x17 |
       uVar2 << 0x1e |
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_xf_c & 0x37ffffff;
  pgraph_bundle(state,0x5d,0,uVar4,true);
  pgraph_bundle(state,0x5f,0,
                (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_xf_c,true);
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		pgraph_kelvin_check_err18(&exp);
		if (!exp.nsource) {
			if (chipset.card_type < 0x40) {
				insrt(exp.xf_mode_b, 18, 1, extr(val, 2, 1));
				insrt(exp.xf_mode_b, 30, 2, extr(val, 0, 2));
				if (chipset.card_type == 0x30) {
					insrt(exp.xf_mode_b, 16, 1, extr(val, 8, 1));
					insrt(exp.xf_mode_b, 17, 1, extr(val, 4, 1));
				}
				pgraph_flush_xf_mode(&exp);
			} else {
				if (pgraph_3d_class(&exp) < PGRAPH_3D_CURIE)
					insrt(exp.bundle_xf_a, 2, 1, extr(val, 2, 1));
				insrt(exp.bundle_xf_a, 28, 1, extr(val, 8, 1));
				insrt(exp.bundle_xf_c, 30, 2, extr(val, 0, 2));
				insrt(exp.bundle_xf_c, 27, 1, extr(val, 4, 1));
				pgraph_bundle(&exp, BUNDLE_XF_A, 0, exp.bundle_xf_a, true);
				pgraph_bundle(&exp, BUNDLE_XF_C, 0, exp.bundle_xf_c, true);
			}
		}
	}